

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O1

void __thiscall uWS::Loop::defer(Loop *this,unique_function<void_()> *cb)

{
  uint uVar1;
  pthread_mutex_t *__mutex;
  undefined8 uVar2;
  ulong uVar3;
  
  __mutex = (pthread_mutex_t *)us_loop_ext();
  uVar1 = pthread_mutex_lock(__mutex);
  if (uVar1 == 0) {
    std::
    vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void()>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void()>>>>
    ::
    emplace_back<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void()>>>
              ((vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void()>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,void()>>>>
                *)((long)__mutex + (long)__mutex[1].__data.__lock * 0x18 + 0x30),cb);
    pthread_mutex_unlock(__mutex);
    us_wakeup_loop(this);
    return;
  }
  uVar3 = (ulong)uVar1;
  uVar2 = std::__throw_system_error(uVar1);
  (**(code **)(uVar3 + 0x10))(uVar3 + 0x10,3,uVar3,0x10,0,0,uVar2);
  return;
}

Assistant:

void defer(fu2::unique_function<void()> &&cb) {
        LoopData *loopData = (LoopData *) us_loop_ext((us_loop_t *) this);

        //if (std::thread::get_id() == ) // todo: add fast path for same thread id
        loopData->deferMutex.lock();
        loopData->deferQueues[loopData->currentDeferQueue].emplace_back(std::move(cb));
        loopData->deferMutex.unlock();

        us_wakeup_loop((us_loop_t *) this);
    }